

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::RemoveDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  lu_byte *plVar1;
  global_State *pgVar2;
  _Base_ptr p_Var3;
  int iVar4;
  lua_State *plVar5;
  lua_State *in_RDX;
  global_State *pgVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  const_iterator __position;
  bool bVar7;
  shared_ptr<Debugger> sVar8;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&L->hook);
  if (iVar4 == 0) {
    if (luaVersion == LUA_JIT) {
      plVar5 = (lua_State *)0x0;
    }
    else {
      plVar5 = GetMainState(in_RDX);
    }
    plVar1 = &L[1].tt;
    pgVar6 = (global_State *)plVar1;
    for (pgVar2 = (global_State *)L[1].top.offset; pgVar2 != (global_State *)0x0;
        pgVar2 = (global_State *)(&pgVar2->totalbytes)[bVar7]) {
      bVar7 = (lua_State *)pgVar2->GCestimate < plVar5;
      if (!bVar7) {
        pgVar6 = pgVar2;
      }
    }
    __position._M_node = (_Base_ptr)plVar1;
    if ((pgVar6 != (global_State *)plVar1) &&
       (__position._M_node = (_Base_ptr)pgVar6, plVar5 < *(lua_State **)((long)pgVar6 + 0x20))) {
      __position._M_node = (_Base_ptr)plVar1;
    }
    if (__position._M_node == (_Base_ptr)plVar1) {
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__position._M_node[1]._M_parent;
      p_Var3 = __position._M_node[1]._M_left;
      (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
                      *)(L + 1),__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&L->hook);
    sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Debugger>)sVar8.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::RemoveDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);
	auto identify = GetUniqueIdentify(L);
	auto it = debuggers.find(identify);
	if (it != debuggers.end())
	{
		auto debugger = it->second;
		debuggers.erase(it);
		return debugger;
	}
	return nullptr;
}